

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop3.c
# Opt level: O0

CURLcode pop3_state_auth_digest_resp(connectdata *conn,int pop3code,pop3state instate)

{
  bool bVar1;
  char *local_48;
  char *rplyb64;
  size_t len;
  char *chlg64;
  SessionHandle *data;
  pop3state local_20;
  CURLcode result;
  pop3state instate_local;
  int pop3code_local;
  connectdata *conn_local;
  
  data._4_4_ = 0;
  chlg64 = (char *)conn->data;
  len = (size_t)(((SessionHandle *)chlg64)->state).buffer;
  rplyb64 = (char *)0x0;
  local_48 = (char *)0x0;
  local_20 = instate;
  result = pop3code;
  _instate_local = conn;
  if (pop3code == 0x2b) {
    len = (size_t)((((SessionHandle *)chlg64)->state).buffer + 2);
    while( true ) {
      bVar1 = true;
      if (*(char *)len != ' ') {
        bVar1 = *(char *)len == '\t';
      }
      if (!bVar1) break;
      len = len + 1;
    }
    data._4_4_ = Curl_sasl_create_digest_md5_message
                           ((SessionHandle *)chlg64,(char *)len,conn->user,conn->passwd,"pop",
                            &local_48,(size_t *)&rplyb64);
    if (data._4_4_ == CURLE_OK) {
      if ((local_48 != (char *)0x0) &&
         (data._4_4_ = Curl_pp_sendf(&(_instate_local->proto).ftpc.pp,"%s",local_48),
         data._4_4_ == CURLE_OK)) {
        state(_instate_local,POP3_AUTH_DIGESTMD5_RESP);
      }
      if (local_48 != (char *)0x0) {
        (*Curl_cfree)(local_48);
      }
    }
    conn_local._4_4_ = data._4_4_;
  }
  else {
    Curl_failf((SessionHandle *)chlg64,"Access denied: %d",(ulong)(uint)pop3code);
    conn_local._4_4_ = CURLE_LOGIN_DENIED;
  }
  return conn_local._4_4_;
}

Assistant:

static CURLcode pop3_state_auth_digest_resp(struct connectdata *conn,
                                            int pop3code,
                                            pop3state instate)
{
  CURLcode result = CURLE_OK;
  struct SessionHandle *data = conn->data;
  char *chlg64 = data->state.buffer;
  size_t len = 0;
  char *rplyb64 = NULL;

  (void)instate; /* no use for this yet */

  if(pop3code != '+') {
    failf(data, "Access denied: %d", pop3code);
    return CURLE_LOGIN_DENIED;
  }

  /* Get the challenge */
  for(chlg64 += 2; *chlg64 == ' ' || *chlg64 == '\t'; chlg64++)
    ;

  /* Create the response message */
  result = Curl_sasl_create_digest_md5_message(data, chlg64, conn->user,
                                               conn->passwd, "pop",
                                               &rplyb64, &len);

  /* Send the response */
  if(!result) {
    if(rplyb64) {
      result = Curl_pp_sendf(&conn->proto.pop3c.pp, "%s", rplyb64);

      if(!result)
        state(conn, POP3_AUTH_DIGESTMD5_RESP);
    }

    Curl_safefree(rplyb64);
  }

  return result;
}